

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O3

void __thiscall MDIOAnalyzer::~MDIOAnalyzer(MDIOAnalyzer *this)

{
  ~MDIOAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

MDIOAnalyzer::~MDIOAnalyzer()
{
    KillThread();
}